

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O2

bool __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::AddChunk
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t capacity)

{
  SharedData *pSVar1;
  CrtAllocator *this_00;
  ChunkHeader *pCVar2;
  
  this_00 = this->baseAllocator_;
  if (this_00 == (CrtAllocator *)0x0) {
    this_00 = (CrtAllocator *)operator_new(1);
    this->baseAllocator_ = this_00;
    this->shared_->ownBaseAllocator = this_00;
  }
  pCVar2 = (ChunkHeader *)CrtAllocator::Malloc(this_00,capacity + 0x18);
  if (pCVar2 != (ChunkHeader *)0x0) {
    pCVar2->capacity = capacity;
    pCVar2->size = 0;
    pSVar1 = this->shared_;
    pCVar2->next = pSVar1->chunkHead;
    pSVar1->chunkHead = pCVar2;
  }
  return pCVar2 != (ChunkHeader *)0x0;
}

Assistant:

bool AddChunk(size_t capacity) {
        if (!baseAllocator_)
            shared_->ownBaseAllocator = baseAllocator_ = RAPIDJSON_NEW(BaseAllocator)();
        if (ChunkHeader* chunk = static_cast<ChunkHeader*>(baseAllocator_->Malloc(SIZEOF_CHUNK_HEADER + capacity))) {
            chunk->capacity = capacity;
            chunk->size = 0;
            chunk->next = shared_->chunkHead;
            shared_->chunkHead = chunk;
            return true;
        }
        else
            return false;
    }